

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O1

Address * __thiscall Settings::getProxyAddr(Settings *this,String *destination_)

{
  DestinationHttpProxyAddrsMap *this_00;
  usize *puVar1;
  usize uVar2;
  Array<Address> *pAVar3;
  uint uVar4;
  Iterator IVar5;
  char *pcVar7;
  ulong uVar8;
  Address *pAVar9;
  ulong uVar10;
  char *pcVar11;
  Array<Address> *pAVar12;
  bool bVar13;
  String destination;
  String local_80;
  String local_58;
  long lVar6;
  
  this_00 = &this->_destinationHttpProxyAddrs;
  IVar5 = HashMap<String,_Array<Address>_>::find(this_00,destination_);
  if (IVar5.item == (this->_destinationHttpProxyAddrs)._end.item) {
    uVar2 = destination_->data->len;
    if (0 < (long)uVar2) {
      pcVar11 = destination_->data->str;
      pcVar7 = pcVar11 + uVar2;
      do {
        if (*pcVar11 == '.') goto LAB_00109dde;
        pcVar11 = pcVar11 + 1;
      } while (pcVar11 < pcVar7);
    }
    pcVar11 = (char *)0x0;
LAB_00109dde:
    if (pcVar11 == (char *)0x0) {
      bVar13 = true;
      IVar5.item = (Item *)0x0;
    }
    else {
      pcVar7 = String::operator_cast_to_char_(destination_);
      String::substr(&local_80,destination_,(ssize)(pcVar11 + (1 - (long)pcVar7)),-1);
      do {
        IVar5 = HashMap<String,_Array<Address>_>::find(this_00,&local_80);
        bVar13 = IVar5.item == (this_00->_end).item;
        if (!bVar13) {
          pAVar9 = ((IVar5.item)->value)._begin.item;
          uVar8 = Math::random();
          IVar5.item = (Item *)(pAVar9 + (uVar8 & 0xffffffff) %
                                         (ulong)((long)((IVar5.item)->value)._end.item -
                                                 (long)((IVar5.item)->value)._begin.item >> 3));
          break;
        }
        if (0 < (long)(local_80.data)->len) {
          pcVar11 = (local_80.data)->str;
          pcVar7 = pcVar11 + (local_80.data)->len;
          do {
            if (*pcVar11 == '.') goto LAB_00109e52;
            pcVar11 = pcVar11 + 1;
          } while (pcVar11 < pcVar7);
        }
        pcVar11 = (char *)0x0;
LAB_00109e52:
        if (pcVar11 == (char *)0x0) break;
        pcVar7 = String::operator_cast_to_char_(&local_80);
        uVar8 = ((long)pcVar11 - (long)pcVar7) + 1;
        uVar10 = (local_80.data)->len;
        if ((long)pcVar11 - (long)pcVar7 < -1) {
          uVar10 = uVar10 + uVar8;
          if ((long)uVar10 < 1) {
            uVar10 = 0;
          }
        }
        else if (uVar8 <= uVar10) {
          uVar10 = uVar8;
        }
        String::String(&local_58,(local_80.data)->str + uVar10,(local_80.data)->len - uVar10);
        String::operator=(&local_80,&local_58);
        if ((local_58.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_58.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
            operator_delete__(local_58.data);
          }
        }
      } while (pcVar11 != (char *)0x0);
      if ((local_80.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_80.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
          operator_delete__(local_80.data);
        }
      }
    }
    if (!bVar13) {
      return (Address *)IVar5.item;
    }
    pAVar12 = &this->_httpProxyAddrs;
    pAVar9 = (this->_httpProxyAddrs)._begin.item;
    lVar6 = Math::random();
    uVar4 = (uint)lVar6;
    pAVar3 = &this->_httpProxyAddrs;
  }
  else {
    pAVar12 = &(IVar5.item)->value;
    pAVar9 = ((IVar5.item)->value)._begin.item;
    lVar6 = Math::random();
    uVar4 = (uint)lVar6;
    pAVar3 = &(IVar5.item)->value;
  }
  return pAVar9 + (ulong)uVar4 %
                  (ulong)((long)(pAVar3->_end).item - (long)(pAVar12->_begin).item >> 3);
}

Assistant:

const Address& Settings::getProxyAddr(const String& destination_)
{
    DestinationHttpProxyAddrsMap::Iterator it = _destinationHttpProxyAddrs.find(destination_);
    if (it != _destinationHttpProxyAddrs.end())
        return getRandomProxyAddr(*it);
    if (const char* x = destination_.find('.'))
    {
        String destination = destination_.substr(x - (const char*)destination_ + 1);
        for (;;)
        {
            it = _destinationHttpProxyAddrs.find(destination);
            if (it != _destinationHttpProxyAddrs.end())
                return getRandomProxyAddr(*it);
            const char* x = destination.find('.');
            if (!x)
                break;
            destination = destination.substr(x - (const char*)destination + 1);
        }
    }
    return getRandomProxyAddr(_httpProxyAddrs);
}